

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O3

string_type * __thiscall
jsoncons::basic_json_options_common<wchar_t>::neginf_to_str_abi_cxx11_
          (string_type *__return_storage_ptr__,basic_json_options_common<wchar_t> *this)

{
  pointer pwVar1;
  string_type *s;
  
  if ((*(ushort *)&this->field_0x8 & 0x30) == 0x10) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
    std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
    std::__cxx11::wstring::_M_append
              ((wchar_t *)__return_storage_ptr__,(ulong)(this->inf_to_str_)._M_dataplus._M_p);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pwVar1 = (this->neginf_to_str_)._M_dataplus._M_p;
    std::__cxx11::wstring::_M_construct<wchar_t*>
              ((wstring *)__return_storage_ptr__,pwVar1,
               pwVar1 + (this->neginf_to_str_)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

string_type neginf_to_str() const
    {
        if (enable_neginf_to_str_)
        {
            return neginf_to_str_;
        }
        else if (enable_inf_to_str_)
        {
            string_type s;
            s.push_back('-');
            s.append(inf_to_str_);
            return s;
        }
        else
        {
            return neginf_to_str_; // empty string
        }
    }